

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

void __thiscall
QArrayDataPointer<LibrarySearchPath>::relocate
          (QArrayDataPointer<LibrarySearchPath> *this,qsizetype offset,LibrarySearchPath **data)

{
  LibrarySearchPath *d_first;
  LibrarySearchPath *pLVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<LibrarySearchPath,long_long>(this->ptr,this->size,d_first);
  if (data != (LibrarySearchPath **)0x0) {
    pLVar1 = *data;
    if ((this->ptr <= pLVar1) && (pLVar1 < this->ptr + this->size)) {
      *data = pLVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }